

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeShaderStorageTests.cpp
# Opt level: O3

int deqp::gles31::Functional::NegativeTestShared::anon_unknown_4::getMaxSSBlockSize
              (NegativeTestContext *ctx,GLenum glShaderType)

{
  GLenum pname;
  int maxSSBlocks;
  GLint local_c;
  
  local_c = 0;
  if ((int)glShaderType < 0x8e87) {
    if (glShaderType == 0x8b30) {
      pname = 0x90da;
      goto LAB_01674072;
    }
    if (glShaderType == 0x8b31) {
      pname = 0x90d6;
      goto LAB_01674072;
    }
    if (glShaderType == 0x8dd9) {
      pname = 0x90d7;
      goto LAB_01674072;
    }
  }
  else {
    if (glShaderType == 0x8e87) {
      pname = 0x90d9;
      goto LAB_01674072;
    }
    if (glShaderType == 0x8e88) {
      pname = 0x90d8;
      goto LAB_01674072;
    }
    if (glShaderType == 0x91b9) {
      pname = 0x90db;
      goto LAB_01674072;
    }
  }
  pname = 0xffffffff;
LAB_01674072:
  glu::CallLogWrapper::glGetIntegerv(&ctx->super_CallLogWrapper,pname,&local_c);
  return local_c;
}

Assistant:

int getMaxSSBlockSize (NegativeTestContext& ctx, glw::GLenum glShaderType)
{
	int maxSSBlocks = 0;
	ctx.glGetIntegerv(getMaxSSBlockSizeEnum(glShaderType), &maxSSBlocks);

	return maxSSBlocks;
}